

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnpc-capnp.c++
# Opt level: O3

bool __thiscall
capnp::anon_unknown_1::CapnpcCapnpMain::isEmptyValue(CapnpcCapnpMain *this,Reader value)

{
  PointerType PVar1;
  bool bVar2;
  PointerReader local_28;
  
  bVar2 = true;
  if (value._reader.dataSize < 0x10) {
    return true;
  }
  switch(*value._reader.data) {
  case 1:
    if (value._reader.dataSize != 0x10) {
      bVar2 = (*(byte *)((long)value._reader.data + 2) & 1) == 0;
    }
    break;
  case 2:
  case 6:
    if (0x17 < value._reader.dataSize) {
      bVar2 = *(char *)((long)value._reader.data + 2) == '\0';
    }
    break;
  case 3:
  case 7:
  case 0xf:
    if (0x1f < value._reader.dataSize) {
      bVar2 = *(short *)((long)value._reader.data + 2) == 0;
    }
    break;
  case 4:
  case 8:
    if (0x3f < value._reader.dataSize) {
      bVar2 = *(int *)((long)value._reader.data + 4) == 0;
    }
    break;
  case 5:
  case 9:
    if (0x7f < value._reader.dataSize) {
      bVar2 = *(long *)((long)value._reader.data + 8) == 0;
    }
    break;
  case 10:
    if (value._reader.dataSize < 0x40) {
      return true;
    }
    bVar2 = *(float *)((long)value._reader.data + 4) == 0.0;
    goto LAB_001427ff;
  case 0xb:
    if (value._reader.dataSize < 0x80) {
      return true;
    }
    bVar2 = *(double *)((long)value._reader.data + 8) == 0.0;
LAB_001427ff:
    bVar2 = (bool)(-bVar2 & 1);
    break;
  case 0xc:
  case 0xd:
  case 0xe:
  case 0x10:
    if (value._reader.pointerCount == 0) {
      local_28.segment = (SegmentReader *)0x0;
      local_28.capTable = (CapTableReader *)0x0;
      local_28.pointer = (WirePointer *)0x0;
      value._reader.nestingLimit = 0x7fffffff;
    }
    else {
      local_28.segment = value._reader.segment;
      local_28.capTable = value._reader.capTable;
      local_28.pointer = value._reader.pointers;
    }
    local_28.nestingLimit = value._reader.nestingLimit;
    PVar1 = _::PointerReader::getPointerType(&local_28);
    bVar2 = PVar1 == NULL_;
  }
  return bVar2;
}

Assistant:

bool isEmptyValue(schema::Value::Reader value) {
    switch (value.which()) {
      case schema::Value::VOID: return true;
      case schema::Value::BOOL: return value.getBool() == false;
      case schema::Value::INT8: return value.getInt8() == 0;
      case schema::Value::INT16: return value.getInt16() == 0;
      case schema::Value::INT32: return value.getInt32() == 0;
      case schema::Value::INT64: return value.getInt64() == 0;
      case schema::Value::UINT8: return value.getUint8() == 0;
      case schema::Value::UINT16: return value.getUint16() == 0;
      case schema::Value::UINT32: return value.getUint32() == 0;
      case schema::Value::UINT64: return value.getUint64() == 0;
      case schema::Value::FLOAT32: return value.getFloat32() == 0;
      case schema::Value::FLOAT64: return value.getFloat64() == 0;
      case schema::Value::TEXT: return !value.hasText();
      case schema::Value::DATA: return !value.hasData();
      case schema::Value::LIST: return !value.hasList();
      case schema::Value::ENUM: return value.getEnum() == 0;
      case schema::Value::STRUCT: return !value.hasStruct();
      case schema::Value::INTERFACE: return true;
      case schema::Value::ANY_POINTER: return true;
    }
    return true;
  }